

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall
Text::Text(Text *this,FontFace face_,string *text_,FontColor color_,float x_,float y_,float z_,
          float windowScale_,float scale_,float kerning_)

{
  FontColor *pFVar1;
  texture_font_t *ptVar2;
  size_t sVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  texture_font_t *ptVar9;
  
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  this->windowScale = 1.0;
  this->rotationX = 0.0;
  this->rotationY = 0.0;
  this->scale = 1.0;
  this->kerning = 0.0;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  pFVar1 = &this->_color;
  this->color = pFVar1;
  this->texture = &this->_texture;
  ptVar2 = &this->_font;
  this_00 = &(this->_font).tex_data;
  (this->_font).tex_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_font).tex_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_font).tex_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_font).glyphs.super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_font).glyphs.super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_font).glyphs.super__Vector_base<texture_glyph_t,_std::allocator<texture_glyph_t>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_texture).id = 0;
  (this->_texture)._width = 0;
  (this->_texture)._height = 0;
  if (face_ == arial_32) {
    ptVar9 = &arial_32pt;
    (this->_font).tex_depth = arial_32pt.tex_depth;
    sVar3 = arial_32pt.tex_height;
    ptVar2->tex_width = arial_32pt.tex_width;
    (this->_font).tex_height = sVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this_00,&arial_32pt.tex_data);
  }
  else if (face_ == arial_28) {
    ptVar9 = &arial_28pt;
    (this->_font).tex_depth = arial_28pt.tex_depth;
    sVar3 = arial_28pt.tex_height;
    ptVar2->tex_width = arial_28pt.tex_width;
    (this->_font).tex_height = sVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this_00,&arial_28pt.tex_data);
  }
  else {
    if (face_ != arial_16) {
      printf("Unsupported font type");
      putchar(10);
      fflush(_stdout);
      exit(1);
    }
    ptVar9 = &arial_16pt;
    (this->_font).tex_depth = arial_16pt.tex_depth;
    sVar3 = arial_16pt.tex_height;
    ptVar2->tex_width = arial_16pt.tex_width;
    (this->_font).tex_height = sVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this_00,&arial_16pt.tex_data);
  }
  fVar5 = ptVar9->size;
  fVar6 = ptVar9->height;
  fVar7 = ptVar9->linegap;
  fVar8 = ptVar9->ascender;
  uVar4 = *(undefined4 *)&ptVar9->field_0x44;
  sVar3 = ptVar9->glyphs_count;
  (this->_font).descender = ptVar9->descender;
  *(undefined4 *)&(this->_font).field_0x44 = uVar4;
  (this->_font).glyphs_count = sVar3;
  (this->_font).size = fVar5;
  (this->_font).height = fVar6;
  (this->_font).linegap = fVar7;
  (this->_font).ascender = fVar8;
  std::vector<texture_glyph_t,_std::allocator<texture_glyph_t>_>::operator=
            (&(this->_font).glyphs,&ptVar9->glyphs);
  pFVar1->r = (char)color_._0_2_;
  pFVar1->g = (char)((ushort)color_._0_2_ >> 8);
  (this->_color).b = color_.b;
  std::__cxx11::string::_M_assign((string *)&this->text);
  this->x = x_;
  this->y = y_;
  this->z = z_;
  this->windowScale = windowScale_;
  this->scale = scale_;
  this->kerning = kerning_;
  return;
}

Assistant:

Text::Text(FontFace face_, std::string text_, FontColor color_, float x_, float y_, float z_, float windowScale_, float scale_, float kerning_) {
    switch(face_) {
    case FontFace::arial_16:  _font = arial_16pt; break;
    case FontFace::arial_28:  _font = arial_28pt; break;
    case FontFace::arial_32:  _font = arial_32pt; break;
    default:
        DEBUG_PRINTLN("Unsupported font type");
        exit(EXIT_FAILURE);
    }

    _color = color_;
    text = text_;
    x = x_;
    y = y_;
    z = z_;
    windowScale = windowScale_;
    scale = scale_;
    kerning = kerning_;
}